

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters_sse42_intr.c
# Opt level: O2

void ihevc_intra_pred_chroma_planar_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint6 uVar5;
  uint uVar6;
  ulong uVar7;
  short sVar8;
  short sVar10;
  undefined1 auVar9 [16];
  short sVar11;
  short sVar13;
  undefined1 auVar12 [16];
  short sVar14;
  short sVar16;
  undefined1 auVar15 [16];
  short sVar17;
  short sVar19;
  undefined1 auVar18 [16];
  undefined1 in_XMM4 [16];
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar23 [16];
  short sVar24;
  short sVar26;
  undefined1 auVar25 [16];
  short sVar27;
  short sVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  undefined1 in_XMM13 [16];
  undefined1 auVar39 [16];
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  
  uVar5 = (uint6)(ushort)((uint)mode >> 0x10);
  if (nt == 4) {
    uVar6 = (uint)CONCAT62(uVar5,3);
  }
  else if (nt == 8) {
    uVar6 = (uint)CONCAT62(uVar5,4);
  }
  else {
    uVar6 = (uint)CONCAT62(uVar5,6);
    if (nt == 0x10) {
      uVar6 = (uint)CONCAT62(uVar5,5);
    }
  }
  if ((nt & 3U) != 0) {
    return;
  }
  auVar9 = pmovzxbw(ZEXT216(*(ushort *)(pu1_ref + (nt * 6 + 2))),
                    ZEXT216(*(ushort *)(pu1_ref + (nt * 6 + 2))));
  uVar3 = nt - 1;
  auVar12 = pmovzxbw(ZEXT216(*(ushort *)(pu1_ref + (long)nt * 2 + -2)),
                     ZEXT216(*(ushort *)(pu1_ref + (long)nt * 2 + -2)));
  auVar15 = pshuflw(ZEXT416((uint)nt),ZEXT416((uint)nt),0);
  auVar18 = pshuflw(ZEXT416(uVar3),ZEXT416(uVar3),0);
  sVar17 = auVar18._0_2_;
  sVar19 = auVar18._2_2_;
  uVar7 = 0;
  uVar4 = (ulong)(uint)nt;
  if (nt < 1) {
    uVar4 = uVar7;
  }
  auVar18 = pmovsxbw(in_XMM4,0x404030302020101);
  auVar21 = pmovzxwq(ZEXT416(uVar6),ZEXT416(uVar6));
  auVar22 = pmovsxbw(in_XMM6,0xfcfcfcfcfcfcfcfc);
  auVar23 = pmovsxbw(in_XMM7,0x404040404040404);
  while (uVar7 != uVar4) {
    uVar6 = (uint)uVar7;
    iVar1 = ~uVar6 + nt * 2;
    auVar25 = pmovzxbw(ZEXT216(CONCAT11(pu1_ref[(long)(iVar1 * 2) + 1],pu1_ref[(long)iVar1 * 2])),
                       ZEXT216(CONCAT11(pu1_ref[(long)(iVar1 * 2) + 1],pu1_ref[(long)iVar1 * 2])));
    uVar7 = uVar7 + 1;
    auVar28 = pshuflw(ZEXT416((uint)uVar7),ZEXT416((uint)uVar7),0);
    sVar11 = auVar12._0_2_;
    sVar27 = auVar28._0_2_;
    sVar13 = auVar12._2_2_;
    sVar29 = auVar28._2_2_;
    sVar14 = auVar15._0_2_;
    sVar16 = auVar15._2_2_;
    auVar28 = ZEXT416(uVar3 - uVar6);
    auVar30 = pshuflw(auVar28,auVar28,0);
    auVar28 = auVar18;
    sVar31 = sVar17;
    sVar32 = sVar19;
    sVar33 = sVar17 + -1;
    sVar34 = sVar19 + -1;
    sVar35 = sVar17 + -2;
    sVar36 = sVar19 + -2;
    sVar37 = sVar17 + -3;
    sVar38 = sVar19 + -3;
    for (lVar2 = 0; lVar2 < nt * 2; lVar2 = lVar2 + 8) {
      auVar39 = pmovzxbw(in_XMM13,*(undefined8 *)(pu1_ref + lVar2 + (long)(nt * 4) + 2));
      sVar8 = auVar30._0_2_;
      in_XMM13._0_2_ = auVar39._0_2_ * sVar8;
      sVar10 = auVar30._2_2_;
      in_XMM13._2_2_ = auVar39._2_2_ * sVar10;
      in_XMM13._4_2_ = auVar39._4_2_ * sVar8;
      in_XMM13._6_2_ = auVar39._6_2_ * sVar10;
      in_XMM13._8_2_ = auVar39._8_2_ * sVar8;
      in_XMM13._10_2_ = auVar39._10_2_ * sVar10;
      in_XMM13._12_2_ = auVar39._12_2_ * sVar8;
      in_XMM13._14_2_ = auVar39._14_2_ * sVar10;
      sVar8 = auVar9._0_2_;
      sVar10 = auVar9._2_2_;
      sVar40 = auVar28._2_2_;
      sVar41 = auVar28._4_2_;
      sVar42 = auVar28._6_2_;
      sVar43 = auVar28._8_2_;
      sVar44 = auVar28._10_2_;
      sVar45 = auVar28._12_2_;
      sVar46 = auVar28._14_2_;
      sVar24 = auVar25._0_2_;
      sVar26 = auVar25._2_2_;
      lVar20 = auVar21._0_8_;
      uVar47 = (ushort)(sVar31 * sVar24 + sVar27 * sVar11 + sVar14 + auVar28._0_2_ * sVar8 +
                       in_XMM13._0_2_) >> lVar20;
      uVar48 = (ushort)(sVar32 * sVar26 + sVar29 * sVar13 + sVar16 + sVar40 * sVar10 +
                       in_XMM13._2_2_) >> lVar20;
      uVar49 = (ushort)(sVar33 * sVar24 + sVar27 * sVar11 + sVar14 + sVar41 * sVar8 + in_XMM13._4_2_
                       ) >> lVar20;
      uVar50 = (ushort)(sVar34 * sVar26 + sVar29 * sVar13 + sVar16 + sVar42 * sVar10 +
                       in_XMM13._6_2_) >> lVar20;
      uVar51 = (ushort)(sVar35 * sVar24 + sVar27 * sVar11 + sVar14 + sVar43 * sVar8 + in_XMM13._8_2_
                       ) >> lVar20;
      uVar52 = (ushort)(sVar36 * sVar26 + sVar29 * sVar13 + sVar16 + sVar44 * sVar10 +
                       in_XMM13._10_2_) >> lVar20;
      uVar53 = (ushort)(sVar37 * sVar24 + sVar27 * sVar11 + sVar14 + sVar45 * sVar8 +
                       in_XMM13._12_2_) >> lVar20;
      uVar54 = (ushort)(sVar38 * sVar26 + sVar29 * sVar13 + sVar16 + sVar46 * sVar10 +
                       in_XMM13._14_2_) >> lVar20;
      *(ulong *)(pu1_dst + lVar2) =
           CONCAT17((0 < (short)uVar54) * ((short)uVar54 < 0x100) * (char)uVar54 -
                    (0xff < (short)uVar54),
                    CONCAT16((0 < (short)uVar53) * ((short)uVar53 < 0x100) * (char)uVar53 -
                             (0xff < (short)uVar53),
                             CONCAT15((0 < (short)uVar52) * ((short)uVar52 < 0x100) * (char)uVar52 -
                                      (0xff < (short)uVar52),
                                      CONCAT14((0 < (short)uVar51) * ((short)uVar51 < 0x100) *
                                               (char)uVar51 - (0xff < (short)uVar51),
                                               CONCAT13((0 < (short)uVar50) *
                                                        ((short)uVar50 < 0x100) * (char)uVar50 -
                                                        (0xff < (short)uVar50),
                                                        CONCAT12((0 < (short)uVar49) *
                                                                 ((short)uVar49 < 0x100) *
                                                                 (char)uVar49 -
                                                                 (0xff < (short)uVar49),
                                                                 CONCAT11((0 < (short)uVar48) *
                                                                          ((short)uVar48 < 0x100) *
                                                                          (char)uVar48 -
                                                                          (0xff < (short)uVar48),
                                                                          (0 < (short)uVar47) *
                                                                          ((short)uVar47 < 0x100) *
                                                                          (char)uVar47 -
                                                                          (0xff < (short)uVar47)))))
                                     )));
      sVar31 = sVar31 + auVar22._0_2_;
      sVar32 = sVar32 + auVar22._2_2_;
      sVar33 = sVar33 + auVar22._4_2_;
      sVar34 = sVar34 + auVar22._6_2_;
      sVar35 = sVar35 + auVar22._8_2_;
      sVar36 = sVar36 + auVar22._10_2_;
      sVar37 = sVar37 + auVar22._12_2_;
      sVar38 = sVar38 + auVar22._14_2_;
      auVar28._0_2_ = auVar28._0_2_ + auVar23._0_2_;
      auVar28._2_2_ = sVar40 + auVar23._2_2_;
      auVar28._4_2_ = sVar41 + auVar23._4_2_;
      auVar28._6_2_ = sVar42 + auVar23._6_2_;
      auVar28._8_2_ = sVar43 + auVar23._8_2_;
      auVar28._10_2_ = sVar44 + auVar23._10_2_;
      auVar28._12_2_ = sVar45 + auVar23._12_2_;
      auVar28._14_2_ = sVar46 + auVar23._14_2_;
    }
    pu1_dst = pu1_dst + dst_strd;
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_planar_sse42(UWORD8 *pu1_ref,
                                          WORD32 src_strd,
                                          UWORD8 *pu1_dst,
                                          WORD32 dst_strd,
                                          WORD32 nt,
                                          WORD32 mode)
{

    WORD32 row, col;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;

    __m128i const_temp_4x32b, const_temp1_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i col_8x16b, const_temp5_4x32b, const_temp6_4x32b, zero_8x16b, const_temp7_4x32b;
    UNUSED(src_strd);
    UNUSED(mode);

    switch(nt)
    {
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;

    /* Planar filtering */

/* setting vallues in  registera*/

//  pu1_ref[2*(two_nt - 1 - row)]
//  pu1_ref[2 * (three_nt + 1)]
//  pu1_ref[2 * (two_nt + 1) + col]
//  pu1_ref[2 * (nt - 1)]

    const_temp_4x32b  = _mm_set_epi16(pu1_ref[2 * (three_nt + 1) + 1], pu1_ref[2 * (three_nt + 1)], pu1_ref[2 * (three_nt + 1) + 1],
                                      pu1_ref[2 * (three_nt + 1)], pu1_ref[2 * (three_nt + 1) + 1], pu1_ref[2 * (three_nt + 1)],
                                      pu1_ref[2 * (three_nt + 1) + 1], pu1_ref[2 * (three_nt + 1)]);

    const_temp1_4x32b = _mm_set_epi16(pu1_ref[2 * (nt - 1) + 1], pu1_ref[2 * (nt - 1)], pu1_ref[2 * (nt - 1) + 1], pu1_ref[2 * (nt - 1)],
                                      pu1_ref[2 * (nt - 1) + 1], pu1_ref[2 * (nt - 1)], pu1_ref[2 * (nt - 1) + 1], pu1_ref[2 * (nt - 1)]);

    const_temp4_4x32b = _mm_set1_epi16(nt - 1);
    const_temp6_4x32b = _mm_set1_epi16(nt);
    const_temp7_4x32b = _mm_set1_epi16(4);

    zero_8x16b = _mm_set1_epi32(0);

    if(nt % 4 == 0)
    {
        const_temp7_4x32b = _mm_set1_epi16(4);

        for(row = 0; row < nt; row++)
        {
            __m128i res_temp_8x16b, row_8x16b, res_temp1_8x16b, res_temp2_8x16b;
            __m128i res_temp3_8x16b;

            const_temp2_4x32b  = _mm_set_epi16(pu1_ref[2 * (two_nt - 1 - row) + 1], pu1_ref[2 * (two_nt - 1 - row)], pu1_ref[2 * (two_nt - 1 - row) + 1],
                                               pu1_ref[2 * (two_nt - 1 - row)], pu1_ref[2 * (two_nt - 1 - row) + 1], pu1_ref[2 * (two_nt - 1 - row)],
                                               pu1_ref[2 * (two_nt - 1 - row) + 1], pu1_ref[2 * (two_nt - 1 - row)]);

            const_temp3_4x32b  = _mm_set1_epi16((row + 1));
            row_8x16b = _mm_set1_epi16((nt - 1 - row));

            const_temp5_4x32b = _mm_set_epi16(3, 3, 2, 2, 1, 1, 0, 0);
            col_8x16b = _mm_set_epi16(4, 4, 3, 3, 2, 2, 1, 1);

            const_temp5_4x32b = _mm_sub_epi16(const_temp4_4x32b, const_temp5_4x32b);

            /*(row + 1) * pu1_ref[nt - 1]*/
            res_temp_8x16b  = _mm_mullo_epi16(const_temp3_4x32b,  const_temp1_4x32b);

            /*(row + 1) * pu1_ref[nt - 1] + nt)*/
            res_temp_8x16b = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);

            for(col = 0; col < 2 * nt; col += 8)
            {
                __m128i src_temp_8x16b;

                /* loding 8bit 16 pixles*/
                src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + 2 * (two_nt + 1) + col));

                src_temp_8x16b =  _mm_cvtepu8_epi16(src_temp_8x16b); /* row=0*/

                /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] */
                res_temp1_8x16b  = _mm_mullo_epi16(src_temp_8x16b,  row_8x16b);

                /*(col + 1) * pu1_ref[three_nt + 1]*/
                res_temp2_8x16b  = _mm_mullo_epi16(const_temp_4x32b,  col_8x16b);

                /*(nt - 1 - col)* pu1_ref[two_nt - 1 - row]*/
                res_temp3_8x16b  = _mm_mullo_epi16(const_temp2_4x32b,  const_temp5_4x32b);

                res_temp1_8x16b = _mm_add_epi16(res_temp_8x16b, res_temp1_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp3_8x16b);

                res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, (log2nt + 1));
                res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, zero_8x16b);

                _mm_storel_epi64((__m128i *)(pu1_dst + (row * dst_strd) + col), res_temp1_8x16b);

                const_temp5_4x32b = _mm_sub_epi16(const_temp5_4x32b, const_temp7_4x32b);
                col_8x16b = _mm_add_epi16(col_8x16b, const_temp7_4x32b);
            } /* inner loop ends here */
        }
    }
}